

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-lattices.cpp
# Opt level: O2

Element __thiscall wasm::RandomFullLattice::getBottom(RandomFullLattice *this)

{
  long lVar1;
  char cVar2;
  _Head_base<0UL,_void_*,_false> extraout_RDX;
  long in_RSI;
  Element EVar3;
  
  lVar1 = *(long *)(in_RSI + 8);
  cVar2 = *(char *)(lVar1 + 0x20);
  if (cVar2 == -1) {
    std::__throw_bad_variant_access("std::visit: variant is valueless");
    cVar2 = *(char *)(lVar1 + 0x20);
  }
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__deduce_visit_result<wasm::RandomElement<wasm::RandomFullLattice>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-fuzz-lattices.cpp:878:5)_&&,_const_std::variant<wasm::analysis::Bool,_wasm::analysis::Integer<unsigned_int>,_wasm::analysis::ValType,_wasm::analysis::Inverted<wasm::RandomFullLattice>,_wasm::analysis::Array<wasm::RandomFullLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomFullLattice>,_wasm::analysis::Tuple<wasm::RandomFullLattice,_wasm::RandomFullLattice>_>_&>
    ::_S_vtable._M_arr[cVar2]._M_data)
            ((anon_class_1_0_00000001 *)this,
             (variant<wasm::analysis::Bool,_wasm::analysis::Integer<unsigned_int>,_wasm::analysis::ValType,_wasm::analysis::Inverted<wasm::RandomFullLattice>,_wasm::analysis::Array<wasm::RandomFullLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomFullLattice>,_wasm::analysis::Tuple<wasm::RandomFullLattice,_wasm::RandomFullLattice>_>
              *)&stack0xffffffffffffffe7);
  EVar3.super_unique_ptr<void,_void_(*)(void_*)>._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>.
  _M_t.super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Head_base<0UL,_void_*,_false>.
  _M_head_impl = extraout_RDX._M_head_impl;
  EVar3.super_unique_ptr<void,_void_(*)(void_*)>._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>.
  _M_t.super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
  super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(void_*),_false>)(_Head_base<1UL,_void_(*)(void_*),_false>)this;
  return (Element)EVar3.super_unique_ptr<void,_void_(*)(void_*)>._M_t.
                  super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                  super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>;
}

Assistant:

RandomFullLattice::Element RandomFullLattice::getBottom() const noexcept {
  return std::visit(
    [](const auto& l) -> Element { return ElementImpl{l.getBottom()}; },
    (const FullLatticeVariant&)*lattice);
}